

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char ** hts_readlist(char *string,int is_file,int *_n)

{
  int iVar1;
  uint uVar2;
  BGZF *f;
  char *pcVar3;
  void *pvVar4;
  char **ppcVar5;
  char *local_78;
  char *p;
  char *q;
  kstring_t str;
  kstream_t *ks;
  BGZF *fp;
  char **s;
  uint local_30;
  int dret;
  int n;
  int m;
  int *_n_local;
  char *pcStack_18;
  int is_file_local;
  char *string_local;
  
  dret = 0;
  local_30 = 0;
  fp = (BGZF *)0x0;
  local_78 = string;
  p = string;
  _n = (uint *)_n;
  _n_local._4_4_ = is_file;
  pcStack_18 = string;
  if (is_file == 0) {
    while( true ) {
      if ((*local_78 == ',') || (*local_78 == '\0')) {
        uVar2 = local_30 + 1;
        if (dret < (int)uVar2) {
          local_30 = (int)local_30 >> 1 | local_30;
          local_30 = (int)local_30 >> 2 | local_30;
          local_30 = (int)local_30 >> 4 | local_30;
          local_30 = (int)local_30 >> 8 | local_30;
          dret = ((int)local_30 >> 0x10 | local_30) + 1;
          local_30 = uVar2;
          fp = (BGZF *)realloc(fp,(long)dret << 3);
          uVar2 = local_30;
        }
        local_30 = uVar2;
        pvVar4 = calloc((size_t)(local_78 + (1 - (long)p)),1);
        *(void **)(&fp->field_0x0 + (long)(int)(local_30 - 1) * 8) = pvVar4;
        strncpy(*(char **)(&fp->field_0x0 + (long)(int)(local_30 - 1) * 8),p,
                (long)local_78 - (long)p);
        p = local_78 + 1;
      }
      if (*local_78 == '\0') break;
      local_78 = local_78 + 1;
    }
  }
  else {
    f = bgzf_open(string,"r");
    if (f == (BGZF *)0x0) {
      return (char **)0x0;
    }
    str.m = 0;
    str.l = 0;
    q = (char *)0x0;
    str.s = (char *)ks_init(f);
    while (iVar1 = ks_getuntil((kstream_t *)str.s,2,(kstring_t *)&q,(int *)((long)&s + 4)),
          -1 < iVar1) {
      if (q != (char *)0x0) {
        uVar2 = local_30 + 1;
        if (dret < (int)uVar2) {
          local_30 = (int)local_30 >> 1 | local_30;
          local_30 = (int)local_30 >> 2 | local_30;
          local_30 = (int)local_30 >> 4 | local_30;
          local_30 = (int)local_30 >> 8 | local_30;
          dret = ((int)local_30 >> 0x10 | local_30) + 1;
          local_30 = uVar2;
          fp = (BGZF *)realloc(fp,(long)dret << 3);
          uVar2 = local_30;
        }
        local_30 = uVar2;
        pcVar3 = strdup((char *)str.m);
        *(char **)(&fp->field_0x0 + (long)(int)(local_30 - 1) * 8) = pcVar3;
      }
    }
    ks_destroy((kstream_t *)str.s);
    bgzf_close(f);
    free((void *)str.m);
  }
  ppcVar5 = (char **)realloc(fp,(long)(int)local_30 << 3);
  *_n = local_30;
  return ppcVar5;
}

Assistant:

char **hts_readlist(const char *string, int is_file, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
    if ( is_file )
    {
#if KS_BGZF
        BGZF *fp = bgzf_open(string, "r");
#else
        gzFile fp = gzopen(string, "r");
#endif
        if ( !fp ) return NULL;

        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0)
        {
            if (str.l == 0) continue;
            n++;
            hts_expand(char*,n,m,s);
            s[n-1] = strdup(str.s);
        }
        ks_destroy(ks);
#if KS_BGZF
        bgzf_close(fp);
#else
        gzclose(fp);
#endif
        free(str.s);
    }
    else
    {
        const char *q = string, *p = string;
        while ( 1 )
        {
            if (*p == ',' || *p == 0)
            {
                n++;
                hts_expand(char*,n,m,s);
                s[n-1] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n-1], q, p - q);
                q = p + 1;
            }
            if ( !*p ) break;
            p++;
        }
    }
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}